

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_update_decoder.cpp
# Opt level: O2

FieldDef *
bidfx_public_api::price::pixie::PriceUpdateDecoder::GetFieldDef
          (FieldDef *__return_storage_ptr__,ByteBuffer *buffer,IDataDictionary *data_dictionary,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
          *price_map,uint32_t fid)

{
  DecodingException *this;
  allocator<char> local_71;
  string local_70;
  optional<bidfx_public_api::price::pixie::FieldDef> fieldDef;
  
  (**data_dictionary->_vptr_IDataDictionary)(&fieldDef,data_dictionary,(ulong)fid);
  if (fieldDef.super__Optional_base<bidfx_public_api::price::pixie::FieldDef,_false,_false>.
      _M_payload.
      super__Optional_payload<bidfx_public_api::price::pixie::FieldDef,_true,_false,_false>.
      super__Optional_payload_base<bidfx_public_api::price::pixie::FieldDef>._M_engaged != false) {
    FieldDef::FieldDef(__return_storage_ptr__,(FieldDef *)&fieldDef);
    std::_Optional_payload_base<bidfx_public_api::price::pixie::FieldDef>::_M_reset
              ((_Optional_payload_base<bidfx_public_api::price::pixie::FieldDef> *)&fieldDef);
    return __return_storage_ptr__;
  }
  this = (DecodingException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"attempted to get a field def which does not exist",&local_71);
  exceptions::DecodingException::DecodingException(this,&local_70);
  __cxa_throw(this,&exceptions::DecodingException::typeinfo,
              exceptions::BidFXException::~BidFXException);
}

Assistant:

FieldDef PriceUpdateDecoder::GetFieldDef(ByteBuffer& buffer, IDataDictionary& data_dictionary,
                                         std::map<std::string, PriceField>& price_map, uint32_t fid)
{
    std::optional<FieldDef> fieldDef = data_dictionary.FieldDefByFid(fid);
    if (!fieldDef)
    {
        throw DecodingException("attempted to get a field def which does not exist");
    }
    return *fieldDef;
}